

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O1

bool duckdb::VectorStringToList::SplitStringList
               (string_t *input,string_t *child_data,idx_t *child_start,Vector *child)

{
  char *pcVar1;
  idx_t *piVar2;
  idx_t *piVar3;
  bool bVar4;
  int iVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *buf;
  idx_t *pos_1;
  bool bVar10;
  string_t sVar11;
  idx_t pos;
  idx_t len;
  optional_idx start_pos;
  SplitStringListOperation state;
  ulong local_88;
  StringCastInputState local_80;
  ulong local_60;
  optional_idx local_58;
  SplitStringListOperation local_50;
  idx_t local_38;
  
  local_80.pos = &local_88;
  local_60 = (ulong)(input->value).pointer.length;
  if (local_60 < 0xd) {
    buf = (input->value).pointer.prefix;
  }
  else {
    buf = (input->value).pointer.ptr;
  }
  local_80.len = &local_60;
  local_88 = 0;
  if (local_60 != 0) {
    uVar9 = 1;
    do {
      uVar8 = uVar9;
      if ((4 < (byte)buf[uVar8 - 1] - 9) && (buf[uVar8 - 1] != 0x20)) break;
      uVar9 = uVar8 + 1;
      local_88 = uVar8;
    } while (uVar8 != local_60);
  }
  if (local_88 == local_60) {
    return false;
  }
  if (buf[local_88] != '[') {
    return false;
  }
  uVar9 = local_88 + 1;
  if (uVar9 < local_60) {
    uVar8 = local_88 + 2;
    local_88 = uVar9;
    do {
      uVar7 = uVar8;
      if ((4 < (byte)buf[uVar7 - 1] - 9) && (uVar9 = local_88, buf[uVar7 - 1] != 0x20)) break;
      uVar8 = uVar7 + 1;
      local_88 = uVar7;
      uVar9 = uVar7;
    } while (uVar7 != local_60);
  }
  local_88 = uVar9;
  local_80.escaped = false;
  bVar10 = false;
  local_80.buf = buf;
  local_50.child_data = child_data;
  local_50.entry_count = child_start;
  local_50.child = child;
LAB_007f6ae7:
  if (local_88 < local_60) {
    local_58.index = 0xffffffffffffffff;
    do {
      if (((local_60 <= local_88) || (buf[local_88] == ',')) || (buf[local_88] == ']')) {
        iVar5 = 1;
        if (local_88 == local_60) goto LAB_007f6c1c;
        if ((local_58.index != 0xffffffffffffffff || buf[local_88] != ']') || (bVar10)) {
          if (local_58.index == 0xffffffffffffffff) {
            sVar11 = HandleString<true>(local_50.child,buf,0,0);
            iVar6 = *local_50.entry_count;
            *(long *)&local_50.child_data[iVar6].value = sVar11.value._0_8_;
            local_50.child_data[iVar6].value.pointer.ptr = sVar11.value._8_8_;
            *local_50.entry_count = *local_50.entry_count + 1;
          }
          else {
            iVar6 = optional_idx::GetIndex(&local_58);
            SplitStringListOperation::HandleValue(&local_50,buf,iVar6,local_38 + 1);
          }
          bVar10 = true;
        }
        piVar3 = local_80.len;
        piVar2 = local_80.pos;
        pcVar1 = local_80.buf;
        iVar5 = 3;
        if (buf[local_88] == ']') goto LAB_007f6c1c;
        local_88 = local_88 + 1;
        uVar9 = *local_80.pos;
        iVar5 = 0;
        if (uVar9 < *local_80.len) goto LAB_007f6bf2;
        goto LAB_007f6c1c;
      }
      bVar4 = ValueStateTransition(&local_80,&local_58,&local_38);
    } while (bVar4);
    iVar5 = 1;
    goto LAB_007f6c1c;
  }
  goto LAB_007f6c29;
  while( true ) {
    uVar9 = uVar9 + 1;
    *piVar2 = uVar9;
    local_80.escaped = false;
    if (*piVar3 <= uVar9) break;
LAB_007f6bf2:
    iVar5 = 0;
    if ((4 < (byte)pcVar1[uVar9] - 9) && (pcVar1[uVar9] != 0x20)) break;
  }
LAB_007f6c1c:
  if (iVar5 != 0) goto code_r0x007f6c24;
  goto LAB_007f6ae7;
code_r0x007f6c24:
  if (iVar5 != 3) {
    return false;
  }
LAB_007f6c29:
  local_88 = local_88 + 1;
  uVar9 = *local_80.pos;
  if (uVar9 < *local_80.len) {
    do {
      if ((4 < (byte)local_80.buf[uVar9] - 9) && (local_80.buf[uVar9] != 0x20)) break;
      uVar9 = uVar9 + 1;
      *local_80.pos = uVar9;
    } while (uVar9 < *local_80.len);
  }
  return local_88 == local_60;
}

Assistant:

bool VectorStringToList::SplitStringList(const string_t &input, string_t *child_data, idx_t &child_start,
                                         Vector &child) {
	SplitStringListOperation state(child_data, child_start, child);
	return SplitStringListInternal<SplitStringListOperation>(input, state);
}